

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O2

TestFunc sglr::rr_util::mapGLTestFunc(deUint32 func)

{
  if (func - 0x200 < 8) {
    return *(TestFunc *)(&DAT_01905428 + (ulong)(func - 0x200) * 4);
  }
  return TESTFUNC_LAST;
}

Assistant:

rr::TestFunc mapGLTestFunc (deUint32 func)
{
	switch (func)
	{
		case GL_ALWAYS:		return rr::TESTFUNC_ALWAYS;
		case GL_EQUAL:		return rr::TESTFUNC_EQUAL;
		case GL_GEQUAL:		return rr::TESTFUNC_GEQUAL;
		case GL_GREATER:	return rr::TESTFUNC_GREATER;
		case GL_LEQUAL:		return rr::TESTFUNC_LEQUAL;
		case GL_LESS:		return rr::TESTFUNC_LESS;
		case GL_NEVER:		return rr::TESTFUNC_NEVER;
		case GL_NOTEQUAL:	return rr::TESTFUNC_NOTEQUAL;
		default:
			DE_ASSERT(false);
			return rr::TESTFUNC_LAST;
	}
}